

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O2

Gia_Man_t *
Gia_ManFindPoPartition
          (Gia_Man_t *p,int SelectShift,int fOnlyCis,int fSetLargest,int fVerbose,
          Vec_Ptr_t **pvPosEquivs)

{
  abctime aVar1;
  Vec_Int_t *vPivots;
  Vec_Wrd_t *vSigns;
  Vec_Ptr_t *p_00;
  Gia_Man_t *pGVar2;
  abctime aVar3;
  int iVar4;
  long lVar5;
  
  aVar1 = Abc_Clock();
  vPivots = Gia_ManFindPivots(p,SelectShift,fOnlyCis,fVerbose);
  vSigns = Gia_ManDeriveSigns(p,vPivots,fVerbose);
  Vec_IntFree(vPivots);
  p_00 = Gia_ManHashOutputs(p,vSigns,fVerbose);
  Vec_WrdFree(vSigns);
  if (fSetLargest == 0) {
    pGVar2 = (Gia_Man_t *)0x0;
  }
  else {
    if (p_00->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                    ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
    }
    pGVar2 = Gia_ManDupCones(p,*(int **)((long)*p_00->pArray + 8),*(int *)((long)*p_00->pArray + 4),
                             1);
  }
  if (pvPosEquivs == (Vec_Ptr_t **)0x0) {
    iVar4 = p_00->nSize;
    for (lVar5 = 0; lVar5 < iVar4; lVar5 = lVar5 + 1) {
      if ((Vec_Ptr_t *)p_00->pArray[lVar5] != (Vec_Ptr_t *)0x0) {
        Vec_PtrFree((Vec_Ptr_t *)p_00->pArray[lVar5]);
      }
    }
    Vec_PtrFree(p_00);
  }
  else {
    *pvPosEquivs = p_00;
    iVar4 = 0x7ad956;
    printf("The algorithm divided %d POs into %d partitions.   ",
           (ulong)(uint)(p->vCos->nSize - p->nRegs),(ulong)(uint)p_00->nSize);
    aVar3 = Abc_Clock();
    Abc_Print(iVar4,"%s =","Time");
    Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar3 - aVar1) / 1000000.0);
  }
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_ManFindPoPartition( Gia_Man_t * p, int SelectShift, int fOnlyCis, int fSetLargest, int fVerbose, Vec_Ptr_t ** pvPosEquivs )
{
    Gia_Man_t * pGia = NULL;
    Vec_Int_t * vPivots;
    Vec_Wrd_t * vSigns;
    Vec_Ptr_t * vParts;
    Vec_Int_t * vPart;
    abctime clk = Abc_Clock();
    vPivots = Gia_ManFindPivots( p, SelectShift, fOnlyCis, fVerbose );
    vSigns = Gia_ManDeriveSigns( p, vPivots, fVerbose );
    Vec_IntFree( vPivots );
    vParts = Gia_ManHashOutputs( p, vSigns, fVerbose );
    Vec_WrdFree( vSigns );
    if ( fSetLargest )
    {
        vPart = Vec_VecEntryInt( (Vec_Vec_t *)vParts, 0 );
        pGia = Gia_ManDupCones( p, Vec_IntArray(vPart), Vec_IntSize(vPart), 1 );
    }
    if ( pvPosEquivs )
    {
        *pvPosEquivs = vParts;
        printf( "The algorithm divided %d POs into %d partitions.   ", Gia_ManPoNum(p), Vec_PtrSize(vParts) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    else
        Vec_VecFree( (Vec_Vec_t *)vParts );
    return pGia;
}